

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::defineAuxData(MLCellLinOp *this)

{
  byte bVar1;
  int *piVar2;
  void *pvVar3;
  DistributionMapping *pDVar4;
  Geometry *ratio_00;
  Geometry *i;
  int iVar5;
  long *in_RDI;
  undefined1 in_stack_0000022b;
  int in_stack_0000022c;
  Geometry *in_stack_00000230;
  DistributionMapping *in_stack_00000238;
  BoxArray *in_stack_00000240;
  MultiMask *in_stack_00000248;
  Orientation in_stack_00000250;
  IntVect ratio;
  int amrlev_2;
  int extent;
  int ngrow;
  Orientation face;
  OrientationIter oitr;
  int mglev_1;
  int amrlev_1;
  int mglev;
  int amrlev;
  int ncomp;
  int in_stack_00000370;
  int in_stack_00000378;
  int in_stack_00000380;
  Geometry *in_stack_000007a0;
  DistributionMapping *in_stack_000007a8;
  DistributionMapping *in_stack_000007b0;
  BoxArray *in_stack_000007b8;
  BoxArray *in_stack_000007c0;
  YAFluxRegister *in_stack_000007c8;
  Geometry *in_stack_00000840;
  IntVect *in_stack_00000848;
  int in_stack_00000850;
  int in_stack_00000858;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *in_stack_fffffffffffffd28;
  array<amrex::MultiMask,_6UL> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd3c;
  OrientationIter OVar6;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_> *in_stack_fffffffffffffd50;
  DistributionMapping *in_stack_fffffffffffffd58;
  BoxArray *in_stack_fffffffffffffd60;
  BndryRegister *in_stack_fffffffffffffd68;
  int crse_value;
  undefined8 in_stack_fffffffffffffd80;
  BoxArray *fba;
  DistributionMapping *cdm;
  BoxArray *cba;
  int fine_value;
  array<amrex::MultiMask,_6UL> *paVar7;
  undefined1 local_50 [32];
  OrientationIter local_30 [8];
  
  std::
  vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
  ::resize((vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
            *)in_stack_fffffffffffffd50,
           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::
  vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
  ::resize((vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
            *)in_stack_fffffffffffffd50,
           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>::resize
            ((vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_> *)
             in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
            );
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)in_stack_fffffffffffffd50,
           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_30[5].face = (**(code **)(*in_RDI + 0x28))();
  for (local_30[4].face = 0; local_30[4].face < *(int *)((long)in_RDI + 0x34);
      local_30[4].face = local_30[4].face + 1) {
    Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28);
    std::vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>::resize
              (in_stack_fffffffffffffd50,
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    for (local_30[3].face = 0; OVar6.face = local_30[3].face,
        piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                            (size_type)in_stack_fffffffffffffd28), OVar6.face < *piVar2;
        local_30[3].face = local_30[3].face + 1) {
      Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                    *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>::operator[]
                ((Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_> *)
                 in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd28 =
           (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffd28 >> 0x20),local_30[5].face);
      BndryRegister::define
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),(int)in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffd4c,(int)in_stack_fffffffffffffd80);
    }
  }
  for (local_30[2].face = 0; local_30[2].face < *(int *)((long)in_RDI + 0x34);
      local_30[2].face = local_30[2].face + 1) {
    Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28);
    std::
    vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>::
    resize((vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
            *)in_stack_fffffffffffffd50,
           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    for (local_30[1].face = 0; OVar6.face = local_30[1].face,
        piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                            (size_type)in_stack_fffffffffffffd28), OVar6.face < *piVar2;
        local_30[1].face = local_30[1].face + 1) {
      OrientationIter::OrientationIter(local_30);
      while (pvVar3 = OrientationIter::operator_cast_to_void_(local_30), pvVar3 != (void *)0x0) {
        local_50._28_4_ = OrientationIter::operator()((OrientationIter *)in_stack_fffffffffffffd28);
        local_50._24_4_ = 1;
        bVar1 = (**(code **)(*in_RDI + 0x228))();
        local_50._20_4_ = ZEXT14((bVar1 & 1) == 0);
        Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                      *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                      *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Orientation::operator_cast_to_int((Orientation *)(local_50 + 0x1c));
        std::array<amrex::MultiMask,_6UL>::operator[]
                  (in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                  ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                      *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
        local_50._16_4_ = local_50._28_4_;
        in_stack_fffffffffffffd28 =
             (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffd28 >> 0x20),1);
        in_stack_fffffffffffffd30 =
             (array<amrex::MultiMask,_6UL> *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),local_50._20_4_);
        MultiMask::define(in_stack_00000248,in_stack_00000240,in_stack_00000238,in_stack_00000230,
                          in_stack_00000250,in_stack_0000022c,in_stack_00000370,in_stack_00000378,
                          in_stack_00000380,(bool)in_stack_0000022b);
        OrientationIter::operator++(local_30);
      }
    }
  }
  for (local_50._12_4_ = (IndexType)0x0; (int)local_50._12_4_ < *(int *)((long)in_RDI + 0x34) + -1;
      local_50._12_4_ = local_50._12_4_ + 1) {
    piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                        (size_type)in_stack_fffffffffffffd28);
    paVar7 = (array<amrex::MultiMask,_6UL> *)local_50;
    IntVect::IntVect((IntVect *)paVar7,*piVar2);
    Vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>::operator[]
              ((Vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_> *)
               in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    cdm = (DistributionMapping *)(in_RDI + 0x16);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    cba = (BoxArray *)0x0;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    fba = (BoxArray *)(in_RDI + 0x19);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    pDVar4 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
             operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    crse_value = (int)((ulong)pDVar4 >> 0x20);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    ratio_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    i = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd30 = paVar7;
    iVar5 = local_50._12_4_ + 1;
    OVar6.face = local_30[5].face;
    paVar7 = in_stack_fffffffffffffd30;
    YAFluxRegister::define
              (in_stack_000007c8,in_stack_000007c0,in_stack_000007b8,in_stack_000007b0,
               in_stack_000007a8,in_stack_000007a0,in_stack_00000840,in_stack_00000848,
               in_stack_00000850,in_stack_00000858);
    fine_value = (int)paVar7;
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)i);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffd30,(size_type)i);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)i);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffd30,(size_type)i);
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)i);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffd30,(size_type)i);
    in_stack_fffffffffffffd28 =
         (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
         ((ulong)i & 0xffffffff00000000);
    makeFineMask(cba,cdm,fba,(IntVect *)ratio_00,crse_value,fine_value);
    std::make_unique<amrex::iMultiFab,amrex::iMultiFab>
              ((iMultiFab *)CONCAT44(in_stack_fffffffffffffd3c,iVar5));
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator=
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffd44,OVar6.face));
    iMultiFab::~iMultiFab((iMultiFab *)0x151744d);
  }
  return;
}

Assistant:

void
MLCellLinOp::defineAuxData ()
{
    BL_PROFILE("MLCellLinOp::defineAuxData()");

    m_undrrelxr.resize(m_num_amr_levels);
    m_maskvals.resize(m_num_amr_levels);
    m_fluxreg.resize(m_num_amr_levels-1);
    m_norm_fine_mask.resize(m_num_amr_levels-1);

    const int ncomp = getNComp();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_undrrelxr[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_undrrelxr[amrlev][mglev].define(m_grids[amrlev][mglev],
                                              m_dmap[amrlev][mglev],
                                              1, 0, 0, ncomp);
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_maskvals[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation face = oitr();
                const int ngrow = 1;
                const int extent = isCrossStencil() ? 0 : 1; // extend to corners
                m_maskvals[amrlev][mglev][face].define(m_grids[amrlev][mglev],
                                                       m_dmap[amrlev][mglev],
                                                       m_geom[amrlev][mglev],
                                                       face, 0, ngrow, extent, 1, true);
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        const IntVect ratio{m_amr_ref_ratio[amrlev]};
        m_fluxreg[amrlev].define(m_grids[amrlev+1][0], m_grids[amrlev][0],
                                 m_dmap[amrlev+1][0], m_dmap[amrlev][0],
                                 m_geom[amrlev+1][0], m_geom[amrlev][0],
                                 ratio, amrlev+1, ncomp);
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(m_grids[amrlev][0], m_dmap[amrlev][0], m_grids[amrlev+1][0],
                          ratio, 1, 0));
    }

#if (AMREX_SPACEDIM != 3)
    m_has_metric_term = !m_geom[0][0].IsCartesian() && info.has_metric_term;
#endif
}